

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int mem_equal(void *_x,void *_y,size_t len)

{
  byte local_31;
  byte *pbStack_30;
  uint8_t t;
  uint8_t *y;
  uint8_t *x;
  size_t len_local;
  void *_y_local;
  void *_x_local;
  
  local_31 = 0;
  pbStack_30 = (byte *)_y;
  y = (uint8_t *)_x;
  for (x = (uint8_t *)len; x != (uint8_t *)0x0; x = x + -1) {
    local_31 = local_31 | *y ^ *pbStack_30;
    pbStack_30 = pbStack_30 + 1;
    y = y + 1;
  }
  return (int)(local_31 == 0);
}

Assistant:

static int mem_equal(const void *_x, const void *_y, size_t len)
{
    const volatile uint8_t *x = _x, *y = _y;
    uint8_t t = 0;

    for (; len != 0; --len)
        t |= *x++ ^ *y++;

    return t == 0;
}